

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O2

void __thiscall
embree::avx::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMv<4>_>::resizeRefsList
          (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMv<4>_> *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  void *ptr;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char cVar7;
  size_t i;
  unsigned_long uVar8;
  void *pvVar9;
  runtime_error *this_00;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  unsigned_long uVar13;
  plus<unsigned_long> local_101;
  anon_class_8_1_8991fb9c local_100;
  unsigned_long local_f8;
  anon_class_16_2_ed117de8_conflict32 local_f0;
  anon_class_24_3_8ee612a4_conflict3 local_e0;
  blocked_range<unsigned_long> local_c8;
  task_group_context context;
  
  uVar8 = *(unsigned_long *)(*(long *)(this + 0x30) + 0x1d8);
  local_f8 = 0;
  local_e0.func = &local_100;
  local_100.this = (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *)this;
  local_e0.identity = &local_f8;
  local_e0.reduction = &local_101;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_c8.my_begin = 0;
  local_c8.my_grainsize = 1;
  local_f0.reduction = &local_101;
  local_f0.func = &local_e0;
  local_c8.my_end = uVar8;
  uVar8 = tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_std::plus<unsigned_long>_>
                    (&local_c8,&local_f8,&local_f0,&local_101,&context);
  cVar7 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar7 != '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"task cancelled");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  if (*(ulong *)(this + 0x48) < uVar8) {
    uVar11 = *(ulong *)(this + 0x50);
    if (uVar11 < uVar8) {
      uVar12 = uVar11;
      uVar13 = uVar8;
      if (uVar11 != 0) {
        for (; uVar13 = uVar12, uVar12 < uVar8; uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
        }
      }
      if (uVar11 != uVar13) {
        ptr = *(void **)(this + 0x58);
        uVar11 = uVar13 << 6;
        (**(code **)**(undefined8 **)(this + 0x38))(*(undefined8 **)(this + 0x38),uVar11,0);
        if (uVar11 < 0x1c00000) {
          pvVar9 = alignedMalloc(uVar11,0x20);
        }
        else {
          pvVar9 = os_malloc(uVar11,(bool *)(this + 0x40));
        }
        lVar10 = 0x20;
        *(void **)(this + 0x58) = pvVar9;
        for (uVar11 = 0; uVar11 < *(ulong *)(this + 0x48); uVar11 = uVar11 + 1) {
          lVar3 = *(long *)(this + 0x58);
          puVar1 = (undefined8 *)((long)ptr + lVar10 + -0x20);
          uVar4 = puVar1[1];
          uVar5 = puVar1[2];
          uVar6 = puVar1[3];
          puVar2 = (undefined8 *)(lVar3 + -0x20 + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          puVar2[2] = uVar5;
          puVar2[3] = uVar6;
          *(undefined8 *)(lVar3 + lVar10) = *(undefined8 *)((long)ptr + lVar10);
          *(undefined4 *)(lVar3 + 8 + lVar10) = *(undefined4 *)((long)ptr + lVar10 + 8);
          lVar10 = lVar10 + 0x40;
        }
        lVar10 = *(long *)(this + 0x50);
        if (ptr != (void *)0x0) {
          if ((ulong)(lVar10 << 6) < 0x1c00000) {
            alignedFree(ptr);
          }
          else {
            os_free(ptr,lVar10 << 6,(bool)this[0x40]);
          }
        }
        if (lVar10 != 0) {
          (**(code **)**(undefined8 **)(this + 0x38))
                    (*(undefined8 **)(this + 0x38),lVar10 * -0x40,1);
        }
        *(unsigned_long *)(this + 0x48) = uVar8;
        *(unsigned_long *)(this + 0x50) = uVar13;
        return;
      }
    }
    *(unsigned_long *)(this + 0x48) = uVar8;
  }
  return;
}

Assistant:

void resizeRefsList ()
      {
        size_t num = parallel_reduce (size_t(0), scene->size(), size_t(0), 
          [this](const range<size_t>& r)->size_t {
            size_t c = 0;
            for (auto i=r.begin(); i<r.end(); ++i) {
              Mesh* mesh = scene->getSafe<Mesh>(i);
              if (mesh == nullptr || mesh->numTimeSteps != 1)
                continue;
              size_t meshSize = mesh->size();
              c += isSmallGeometry(mesh) ? Primitive::blocks(meshSize) : 1;
            }
            return c;
          },
          std::plus<size_t>()
        );

        if (refs.size() < num) {
          refs.resize(num);
        }
      }